

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O0

void k051649_w(void *chip,UINT8 offset,UINT8 data)

{
  k051649_state *info;
  UINT8 data_local;
  UINT8 offset_local;
  void *chip_local;
  
  if ((offset & 1) == 0) {
    *(UINT8 *)((long)chip + 0x101) = data;
  }
  else if ((offset & 1) == 1) {
    switch(offset >> 1) {
    case '\0':
    case '\x04':
      if (*(char *)((long)chip + 0x102) == '\0') {
        k051649_waveform_w(chip,*(UINT8 *)((long)chip + 0x101),data);
      }
      else {
        k052539_waveform_w(chip,*(UINT8 *)((long)chip + 0x101),data);
      }
      break;
    case '\x01':
      k051649_frequency_w(chip,*(UINT8 *)((long)chip + 0x101),data);
      break;
    case '\x02':
      k051649_volume_w(chip,*(UINT8 *)((long)chip + 0x101),data);
      break;
    case '\x03':
      k051649_keyonoff_w(chip,*(UINT8 *)((long)chip + 0x101),data);
      break;
    case '\x05':
      k051649_test_w(chip,*(UINT8 *)((long)chip + 0x101),data);
    }
  }
  return;
}

Assistant:

static void k051649_w(void *chip, UINT8 offset, UINT8 data)
{
	k051649_state *info = (k051649_state *)chip;
	
	switch(offset & 1)
	{
	case 0x00:
		info->cur_reg = data;
		break;
	case 0x01:
		switch(offset >> 1)
		{
		case 0x00:
		case 0x04:
			if (! info->mode_plus)
				k051649_waveform_w(chip, info->cur_reg, data);
			else
				k052539_waveform_w(chip, info->cur_reg, data);
			break;
		case 0x01:
			k051649_frequency_w(chip, info->cur_reg, data);
			break;
		case 0x02:
			k051649_volume_w(chip, info->cur_reg, data);
			break;
		case 0x03:
			k051649_keyonoff_w(chip, info->cur_reg, data);
			break;
		case 0x05:
			k051649_test_w(chip, info->cur_reg, data);
			break;
		}
		break;
	}
	
	return;
}